

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void __thiscall llvm::APInt::insertBits(APInt *this,APInt *subBits,uint bitPosition)

{
  uint64_t *puVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint64_t *__src;
  uint64_t uVar7;
  uint local_54;
  uint i;
  uint64_t mask_2;
  uint remainingBits;
  uint numWholeSubWords;
  uint64_t mask_1;
  uint hi1Word;
  uint loWord;
  uint loBit;
  uint64_t mask;
  uint subBitWidth;
  uint bitPosition_local;
  APInt *subBits_local;
  APInt *this_local;
  
  uVar3 = getBitWidth(subBits);
  bVar2 = false;
  if ((uVar3 != 0) && (bVar2 = false, uVar3 + bitPosition <= this->BitWidth)) {
    bVar2 = true;
  }
  if (bVar2) {
    if (uVar3 == this->BitWidth) {
      operator=(this,subBits);
    }
    else {
      bVar2 = isSingleWord(this);
      if (bVar2) {
        (this->U).VAL =
             ((0xffffffffffffffffU >> (0x40U - (char)uVar3 & 0x3f)) << ((byte)bitPosition & 0x3f) ^
             0xffffffffffffffff) & (this->U).VAL;
        (this->U).VAL = (subBits->U).VAL << ((byte)bitPosition & 0x3f) | (this->U).VAL;
      }
      else {
        uVar4 = whichBit(bitPosition);
        uVar5 = whichWord(bitPosition);
        uVar6 = whichWord((bitPosition + uVar3) - 1);
        if (uVar5 == uVar6) {
          (this->U).pVal[uVar5] =
               ((0xffffffffffffffffU >> (0x40U - (char)uVar3 & 0x3f)) << ((byte)uVar4 & 0x3f) ^
               0xffffffffffffffff) & (this->U).pVal[uVar5];
          (this->U).pVal[uVar5] = (subBits->U).VAL << ((byte)uVar4 & 0x3f) | (this->U).pVal[uVar5];
        }
        else if (uVar4 == 0) {
          puVar1 = (this->U).pVal;
          __src = getRawData(subBits);
          memcpy(puVar1 + uVar5,__src,(ulong)((uVar3 >> 6) << 3));
          if ((uVar3 & 0x3f) != 0) {
            (this->U).pVal[uVar6] =
                 (0xffffffffffffffffU >> (0x40U - (char)(uVar3 & 0x3f) & 0x3f) ^ 0xffffffffffffffff)
                 & (this->U).pVal[uVar6];
            uVar7 = getWord(subBits,uVar3 - 1);
            (this->U).pVal[uVar6] = uVar7 | (this->U).pVal[uVar6];
          }
        }
        else {
          for (local_54 = 0; local_54 != uVar3; local_54 = local_54 + 1) {
            bVar2 = operator[](subBits,local_54);
            if (bVar2) {
              setBit(this,bitPosition + local_54);
            }
            else {
              clearBit(this,bitPosition + local_54);
            }
          }
        }
      }
    }
    return;
  }
  __assert_fail("0 < subBitWidth && (subBitWidth + bitPosition) <= BitWidth && \"Illegal bit insertion\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x15b,"void llvm::APInt::insertBits(const APInt &, unsigned int)");
}

Assistant:

void APInt::insertBits(const APInt &subBits, unsigned bitPosition) {
  unsigned subBitWidth = subBits.getBitWidth();
  assert(0 < subBitWidth && (subBitWidth + bitPosition) <= BitWidth &&
         "Illegal bit insertion");

  // Insertion is a direct copy.
  if (subBitWidth == BitWidth) {
    *this = subBits;
    return;
  }

  // Single word result can be done as a direct bitmask.
  if (isSingleWord()) {
    uint64_t mask = WORD_MAX >> (APINT_BITS_PER_WORD - subBitWidth);
    U.VAL &= ~(mask << bitPosition);
    U.VAL |= (subBits.U.VAL << bitPosition);
    return;
  }

  unsigned loBit = whichBit(bitPosition);
  unsigned loWord = whichWord(bitPosition);
  unsigned hi1Word = whichWord(bitPosition + subBitWidth - 1);

  // Insertion within a single word can be done as a direct bitmask.
  if (loWord == hi1Word) {
    uint64_t mask = WORD_MAX >> (APINT_BITS_PER_WORD - subBitWidth);
    U.pVal[loWord] &= ~(mask << loBit);
    U.pVal[loWord] |= (subBits.U.VAL << loBit);
    return;
  }

  // Insert on word boundaries.
  if (loBit == 0) {
    // Direct copy whole words.
    unsigned numWholeSubWords = subBitWidth / APINT_BITS_PER_WORD;
    memcpy(U.pVal + loWord, subBits.getRawData(),
           numWholeSubWords * APINT_WORD_SIZE);

    // Mask+insert remaining bits.
    unsigned remainingBits = subBitWidth % APINT_BITS_PER_WORD;
    if (remainingBits != 0) {
      uint64_t mask = WORD_MAX >> (APINT_BITS_PER_WORD - remainingBits);
      U.pVal[hi1Word] &= ~mask;
      U.pVal[hi1Word] |= subBits.getWord(subBitWidth - 1);
    }
    return;
  }

  // General case - set/clear individual bits in dst based on src.
  // TODO - there is scope for optimization here, but at the moment this code
  // path is barely used so prefer readability over performance.
  for (unsigned i = 0; i != subBitWidth; ++i) {
    if (subBits[i])
      setBit(bitPosition + i);
    else
      clearBit(bitPosition + i);
  }
}